

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O1

void __thiscall avro::DataFileReaderBase::readHeader(DataFileReaderBase *this)

{
  Metadata *this_00;
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  Node *__tmp;
  iterator iVar6;
  undefined8 *puVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  sp_counted_base *v_00;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  sp_counted_base *v_01;
  bool bVar8;
  undefined1 auVar9 [16];
  Magic m;
  istringstream iss;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  array<unsigned_char,_4UL> local_1dc;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  peVar2 = (this->decoder_).px;
  (*peVar2->_vptr_Decoder[2])(peVar2,(this->stream_)._M_ptr);
  codec_traits<boost::array<unsigned_char,_4UL>_>::decode((this->decoder_).px,&local_1dc);
  if (magic != local_1dc.elems) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x18);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                   "Invalid data file. Magic does not match: ",&this->filename_);
    std::runtime_error::runtime_error((runtime_error *)(puVar7 + 1),(string *)local_1b8);
    *puVar7 = 0x1cd6f0;
    puVar7[1] = 0x1cd720;
    __cxa_throw(puVar7,&Exception::typeinfo,Exception::~Exception);
  }
  this_00 = &this->metadata_;
  codec_traits<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  ::decode((this->decoder_).px,this_00);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_SCHEMA_KEY_abi_cxx11_);
  p_Var1 = &(this->metadata_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"No schema in metadata","");
    std::runtime_error::runtime_error((runtime_error *)(puVar7 + 1),(string *)local_1b8);
    *puVar7 = 0x1cd6f0;
    puVar7[1] = 0x1cd720;
    __cxa_throw(puVar7,&Exception::typeinfo,Exception::~Exception);
  }
  toString_abi_cxx11_(&local_220,(avro *)(iVar6._M_node + 2),v);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b8,(string *)&local_220,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  ValidSchema::ValidSchema((ValidSchema *)&local_220);
  compileJsonSchema((istream *)local_1b8,(ValidSchema *)&local_220);
  local_200._M_dataplus._M_p = local_220._M_dataplus._M_p;
  local_200._M_string_length = local_220._M_string_length;
  if ((sp_counted_base *)local_220._M_string_length != (sp_counted_base *)0x0) {
    LOCK();
    *(uint_least32_t *)(local_220._M_string_length + 8) =
         *(uint_least32_t *)(local_220._M_string_length + 8) + 1;
    UNLOCK();
  }
  boost::detail::shared_count::~shared_count((shared_count *)&local_220._M_string_length);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b8);
  std::ios_base::~ios_base(local_140);
  sVar4 = local_200._M_string_length;
  _Var3._M_p = local_200._M_dataplus._M_p;
  local_200._M_dataplus._M_p = (pointer)0x0;
  local_200._M_string_length = 0;
  local_1b8._0_8_ = (this->dataSchema_).root_.px;
  local_1b8._8_8_ = (this->dataSchema_).root_.pn.pi_;
  (this->dataSchema_).root_.px = (element_type *)_Var3._M_p;
  (this->dataSchema_).root_.pn.pi_ = (sp_counted_base *)sVar4;
  boost::detail::shared_count::~shared_count((shared_count *)(local_1b8 + 8));
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_string_length);
  if ((this->readerSchema_).root_.px == (element_type *)0x0) {
    boost::shared_ptr<avro::Node>::operator=
              (&(this->readerSchema_).root_,&(this->dataSchema_).root_);
  }
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&this_00->_M_t,(key_type *)(anonymous_namespace)::AVRO_CODEC_KEY_abi_cxx11_);
  v_01 = v_00;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
LAB_00189514:
    bVar8 = false;
  }
  else {
    toString_abi_cxx11_((string *)local_1b8,(avro *)(iVar6._M_node + 2),
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_00);
    v_01 = (sp_counted_base *)local_1b8._8_8_;
    if ((sp_counted_base *)local_1b8._8_8_ != _DAT_001d63e8) goto LAB_00189514;
    if ((sp_counted_base *)local_1b8._8_8_ == (sp_counted_base *)0x0) {
      bVar8 = true;
    }
    else {
      iVar5 = bcmp((void *)local_1b8._0_8_,(anonymous_namespace)::AVRO_DEFLATE_CODEC_abi_cxx11_,
                   local_1b8._8_8_);
      bVar8 = iVar5 == 0;
      v_01 = extraout_RDX;
    }
  }
  if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
     ((element_type *)local_1b8._0_8_ != (element_type *)(local_1b8 + 0x10))) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    v_01 = extraout_RDX_00;
  }
  if (bVar8) {
    this->codec_ = DEFLATE_CODEC;
    goto LAB_001895be;
  }
  this->codec_ = NULL_CODEC;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
LAB_00189596:
    bVar8 = false;
  }
  else {
    toString_abi_cxx11_(&local_220,(avro *)(iVar6._M_node + 2),
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)v_01);
    bVar8 = true;
    if ((sp_counted_base *)local_220._M_string_length == _DAT_001d63c8) {
      if ((sp_counted_base *)local_220._M_string_length == (sp_counted_base *)0x0)
      goto LAB_00189596;
      iVar5 = bcmp(local_220._M_dataplus._M_p,(anonymous_namespace)::AVRO_NULL_CODEC_abi_cxx11_,
                   local_220._M_string_length);
      bVar8 = iVar5 != 0;
    }
  }
  if (((_Rb_tree_header *)iVar6._M_node != p_Var1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2)) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (bVar8) {
    auVar9 = __cxa_allocate_exception(0x18);
    puVar7 = auVar9._0_8_;
    toString_abi_cxx11_(&local_1d8,(avro *)(iVar6._M_node + 2),auVar9._8_8_);
    std::operator+(&local_200,"Unknown codec in data file: ",&local_1d8);
    std::runtime_error::runtime_error((runtime_error *)(puVar7 + 1),(string *)&local_200);
    *puVar7 = 0x1cd6f0;
    puVar7[1] = 0x1cd720;
    __cxa_throw(puVar7,&Exception::typeinfo,Exception::~Exception);
  }
LAB_001895be:
  codec_traits<boost::array<unsigned_char,_16UL>_>::decode((this->decoder_).px,&this->sync_);
  return;
}

Assistant:

void DataFileReaderBase::readHeader()
{
    decoder_->init(*stream_);
    Magic m;
    avro::decode(*decoder_, m);
    if (magic != m) {
        throw Exception("Invalid data file. Magic does not match: "
            + filename_);
    }
    avro::decode(*decoder_, metadata_);
    Metadata::const_iterator it = metadata_.find(AVRO_SCHEMA_KEY);
    if (it == metadata_.end()) {
        throw Exception("No schema in metadata");
    }

    dataSchema_ = makeSchema(it->second);
    if (! readerSchema_.root()) {
        readerSchema_ = dataSchema();
    }

    it = metadata_.find(AVRO_CODEC_KEY);
    if (it != metadata_.end() && toString(it->second) == AVRO_DEFLATE_CODEC) {
        codec_ = DEFLATE_CODEC;
    } else {
        codec_ = NULL_CODEC;
        if (it != metadata_.end() && toString(it->second) != AVRO_NULL_CODEC) {
            throw Exception("Unknown codec in data file: " + toString(it->second));
        }
    }

    avro::decode(*decoder_, sync_);
}